

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O3

void __thiscall soplex::SPxLPBase<double>::unscaleLP(SPxLPBase<double> *this)

{
  SPxOut *pSVar1;
  SPxScaler<double> *pSVar2;
  char cVar3;
  Verbosity old_verbosity;
  Verbosity local_1c;
  
  pSVar1 = this->spxout;
  if ((pSVar1 != (SPxOut *)0x0) && (4 < (int)pSVar1->m_verbosity)) {
    local_1c = pSVar1->m_verbosity;
    (*pSVar1->_vptr_SPxOut[2])();
    pSVar1 = this->spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar1->m_streams[pSVar1->m_verbosity],"remove persistent scaling of LP",0x1f);
    cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                    cVar3);
    std::ostream::put(cVar3);
    std::ostream::flush();
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_1c);
  }
  pSVar2 = this->lp_scaler;
  if (pSVar2 == (SPxScaler<double> *)0x0) {
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (local_1c = pSVar1->m_verbosity, 4 < (int)local_1c)) {
      (*pSVar1->_vptr_SPxOut[2])();
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"no LP scaler available",0x16);
      cVar3 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
      std::ios::widen((char)*(undefined8 *)(*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18)
                      + cVar3);
      std::ostream::put(cVar3);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_1c);
    }
  }
  else {
    (*pSVar2->_vptr_SPxScaler[0xe])(pSVar2,this);
  }
  return;
}

Assistant:

void SPxLPBase<R>::unscaleLP()
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "remove persistent scaling of LP" << std::endl;)

   if(lp_scaler)
   {
      lp_scaler->unscale(*this);
   }
   else
   {
      SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "no LP scaler available" << std::endl;)
   }
}